

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void test4(void)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  varchar<10UL> lhs;
  varchar<11UL> rhs;
  
  varchar<10UL>::varchar(&lhs,"test");
  varchar<11UL>::varchar(&rhs,"hello");
  bVar1 = varchar<10ul>::operator!=((varchar<10ul> *)&lhs,&rhs);
  if (bVar1) {
    bVar1 = varchar<11ul>::operator!=((varchar<11ul> *)&rhs,&lhs);
    if (bVar1) {
      bVar1 = varchar<10ul>::operator==((varchar<10ul> *)&lhs,&rhs);
      if (bVar1) {
        __assertion = "!(lhs == rhs)";
        __line = 0x20;
      }
      else {
        bVar1 = varchar<11ul>::operator==((varchar<11ul> *)&rhs,&lhs);
        if (!bVar1) {
          return;
        }
        __assertion = "!(rhs == lhs)";
        __line = 0x21;
      }
    }
    else {
      __assertion = "rhs != lhs";
      __line = 0x1f;
    }
  }
  else {
    __assertion = "lhs != rhs";
    __line = 0x1e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mpapierski[P]varchar/tests/test_suite.cpp"
                ,__line,"void test4()");
}

Assistant:

void test4()
{
	varchar<10> lhs = "test";
	varchar<11> rhs = "hello";
	assert(lhs != rhs);
	assert(rhs != lhs);
	assert(!(lhs == rhs));
	assert(!(rhs == lhs));
}